

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_align(BuildCtx *ctx,int bits)

{
  int bits_local;
  BuildCtx *ctx_local;
  
  if (ctx->mode < BUILD_machasm) {
    fprintf((FILE *)ctx->fp,"\t.p2align %d\n",(ulong)(uint)bits);
  }
  else if (ctx->mode == BUILD_machasm) {
    fprintf((FILE *)ctx->fp,"\t.align %d\n",(ulong)(uint)bits);
  }
  return;
}

Assistant:

static void emit_asm_align(BuildCtx *ctx, int bits)
{
  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.p2align %d\n", bits);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp, "\t.align %d\n", bits);
    break;
  default:
    break;
  }
}